

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool ParameterTraits<std::pair<int,_int>_>::convert(string *v,RepType *r)

{
  int iVar1;
  pair<int,_int> *in_RSI;
  int atom2;
  int atom1;
  StringTokenizer tokenizer;
  int *in_stack_ffffffffffffff18;
  errorStruct *peVar2;
  pair<int,_int> in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  StringTokenizer *this;
  int local_b4;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  StringTokenizer *in_stack_ffffffffffffff60;
  undefined1 local_91 [121];
  pair<int,_int> *local_18;
  bool local_1;
  
  this = (StringTokenizer *)local_91;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffff60->tokenString_,
             (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  OpenMD::StringTokenizer::StringTokenizer
            (in_stack_ffffffffffffff60,
             (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  iVar1 = OpenMD::StringTokenizer::countTokens
                    ((StringTokenizer *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (iVar1 != 2) {
    peVar2 = &painCave;
    snprintf(painCave.errMsg,2000,
             "ParameterManager Error: Incorrect number of tokens to make a pair!\n");
    peVar2->severity = 1;
    peVar2->isFatal = 1;
    simError();
  }
  else {
    OpenMD::StringTokenizer::nextTokenAsInt(this);
    OpenMD::StringTokenizer::nextTokenAsInt(this);
    in_stack_ffffffffffffff20 = std::make_pair<int&,int&>(in_stack_ffffffffffffff18,(int *)0x248d09)
    ;
    local_b4 = in_stack_ffffffffffffff20.first;
    std::pair<int,_int>::operator=(local_18,(type)&local_b4);
  }
  local_1 = iVar1 == 2;
  OpenMD::StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_ffffffffffffff20);
  return (bool)(local_1 & 1);
}

Assistant:

static bool convert(std::string v, RepType& r) {
    OpenMD::StringTokenizer tokenizer(v, " ;,\t\n\r");
    if (tokenizer.countTokens() == 2) {
      int atom1 = tokenizer.nextTokenAsInt();
      int atom2 = tokenizer.nextTokenAsInt();
      r         = std::make_pair(atom1, atom2);
      return true;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ParameterManager Error: "
               "Incorrect number of tokens to make a pair!\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    return false;
  }